

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BaseExpression.cpp
# Opt level: O2

size_t __thiscall
Kandinsky::BaseExpression::sizeOfAllNodes
          (BaseExpression *this,shared_ptr<Kandinsky::BaseExpression> *thisSharedPtr)

{
  int iVar1;
  int iVar2;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  _Rb_tree<Kandinsky::Variable,_Kandinsky::Variable,_std::_Identity<Kandinsky::Variable>,_Kandinsky::VariableLessThanComparator,_std::allocator<Kandinsky::Variable>_>
  _Stack_58;
  
  iVar1 = (*this->_vptr_BaseExpression[7])();
  iVar2 = (*this->_vptr_BaseExpression[9])(this);
  (*this->_vptr_BaseExpression[3])(&_Stack_58,this,thisSharedPtr);
  std::
  _Rb_tree<Kandinsky::Variable,_Kandinsky::Variable,_std::_Identity<Kandinsky::Variable>,_Kandinsky::VariableLessThanComparator,_std::allocator<Kandinsky::Variable>_>
  ::~_Rb_tree(&_Stack_58);
  return _Stack_58._M_impl.super__Rb_tree_header._M_node_count * 0x58 + CONCAT44(extraout_var,iVar1)
         + CONCAT44(extraout_var_00,iVar2) * 0x30;
}

Assistant:

size_t BaseExpression::sizeOfAllNodes(
        const std::shared_ptr<BaseExpression>& thisSharedPtr) const
    {
        return sizeOfInternalNodes()
            + numberOfConstants() * sizeof(Constant)
            + variables(thisSharedPtr).size() * sizeof(VariableExpression);
    }